

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

int __thiscall
sqvector<SQObjectPtr>::copy(sqvector<SQObjectPtr> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  SQUnsignedInteger i;
  SQUnsignedInteger in_stack_ffffffffffffffc8;
  ulong uVar1;
  sqvector<SQObjectPtr> *in_stack_ffffffffffffffd0;
  SQObjectPtr local_20;
  EVP_PKEY_CTX *local_10;
  sqvector<SQObjectPtr> *local_8;
  
  local_10 = dst;
  local_8 = this;
  if (this->_size != 0) {
    ::SQObjectPtr::SQObjectPtr(&local_20);
    resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(SQObjectPtr *)this);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  if (this->_allocated < *(ulong *)(local_10 + 8)) {
    _realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  for (uVar1 = 0; uVar1 < *(ulong *)(local_10 + 8); uVar1 = uVar1 + 1) {
    ::SQObjectPtr::SQObjectPtr
              (this->_vals + uVar1,(SQObjectPtr *)(*(long *)local_10 + uVar1 * 0x10));
  }
  this->_size = *(SQUnsignedInteger *)(local_10 + 8);
  return (int)this;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }